

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_message.c
# Opt level: O2

int ValidateAsciiCharactersFilter(char *mapKey,char *mapValue)

{
  _Bool _Var1;
  int iVar2;
  
  _Var1 = ContainsValidUsAscii(mapKey);
  if (_Var1) {
    _Var1 = ContainsValidUsAscii(mapValue);
    iVar2 = 0x43;
    if (_Var1) {
      iVar2 = 0;
    }
  }
  else {
    iVar2 = 0x43;
  }
  return iVar2;
}

Assistant:

static int ValidateAsciiCharactersFilter(const char* mapKey, const char* mapValue)
{
    int result;
    if (!ContainsValidUsAscii(mapKey) || !ContainsValidUsAscii(mapValue))
    {
        result = MU_FAILURE;
    }
    else
    {
        result = 0;
    }
    return result;
}